

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Converter::ConvertToStore
          (Converter *this,char *a_pszString)

{
  ulong uVar1;
  size_t sVar2;
  ulong __n;
  bool bVar3;
  
  sVar2 = strlen(a_pszString);
  if (sVar2 + 1 == 0xffffffffffffffff) {
    bVar3 = false;
  }
  else {
    while (uVar1 = (this->m_scratch)._M_string_length, uVar1 < sVar2 + 1) {
      std::__cxx11::string::resize((ulong)&this->m_scratch,(char)uVar1 * '\x02');
    }
    sVar2 = strlen(a_pszString);
    __n = sVar2 + 1;
    bVar3 = __n <= uVar1;
    if (__n <= uVar1) {
      memcpy((this->m_scratch)._M_dataplus._M_p,a_pszString,__n);
    }
  }
  return bVar3;
}

Assistant:

bool ConvertToStore(const SI_CHAR * a_pszString) {
            size_t uLen = SizeToStore(a_pszString);
            if (uLen == (size_t)(-1)) {
                return false;
            }
            while (uLen > m_scratch.size()) {
                m_scratch.resize(m_scratch.size() * 2);
            }
            return SI_CONVERTER::ConvertToStore(
                a_pszString,
                const_cast<char*>(m_scratch.data()),
                m_scratch.size());
        }